

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseTextureInfo(TextureInfo *texinfo,string *err,json *o)

{
  json *o_00;
  json *err_00;
  bool bVar1;
  undefined1 *ret;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  json *local_28;
  json *o_local;
  string *err_local;
  TextureInfo *texinfo_local;
  
  if (texinfo == (TextureInfo *)0x0) {
    texinfo_local._7_1_ = false;
  }
  else {
    local_28 = o;
    o_local = (json *)err;
    err_local = (string *)texinfo;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"index",&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"TextureInfo",&local_81);
    bVar1 = ParseIntegerProperty(&texinfo->index,err,o,&local_48,true,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    err_00 = o_local;
    o_00 = local_28;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ret = &err_local->field_0x4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,"texCoord",&local_a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"",&local_d1);
      ParseIntegerProperty((int *)ret,(string *)err_00,o_00,&local_a8,false,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      ParseExtensionsProperty((ExtensionMap *)(err_local + 5),(string *)o_local,local_28);
      ParseExtrasProperty((Value *)&err_local->_M_string_length,local_28);
      texinfo_local._7_1_ = true;
    }
    else {
      texinfo_local._7_1_ = false;
    }
  }
  return texinfo_local._7_1_;
}

Assistant:

static bool ParseTextureInfo(TextureInfo *texinfo, std::string *err,
                             const json &o) {
  if (texinfo == nullptr) {
    return false;
  }

  if (!ParseIntegerProperty(&texinfo->index, err, o, "index",
                            /* required */ true, "TextureInfo")) {
    return false;
  }

  ParseIntegerProperty(&texinfo->texCoord, err, o, "texCoord", false);

  ParseExtensionsProperty(&texinfo->extensions, err, o);
  ParseExtrasProperty(&texinfo->extras, o);

  return true;
}